

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_negation.c
# Opt level: O0

_Bool bitset_container_negation_range_inplace
                (bitset_container_t *src,int range_start,int range_end,container_t **dst)

{
  int iVar1;
  array_container_t *paVar2;
  bitset_container_t *in_RCX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  int *in_RDI;
  bitset_container_t *in_stack_ffffffffffffffd8;
  bool local_1;
  
  bitset_flip_range(*(uint64_t **)(in_RDI + 2),in_ESI,in_EDX);
  iVar1 = bitset_container_compute_cardinality(in_stack_ffffffffffffffd8);
  *in_RDI = iVar1;
  iVar1 = *in_RDI;
  if (iVar1 < 0x1001) {
    paVar2 = array_container_from_bitset(in_RCX);
    *(array_container_t **)in_RCX = paVar2;
    bitset_container_free((bitset_container_t *)0x15031f);
  }
  else {
    *(int **)in_RCX = in_RDI;
  }
  local_1 = iVar1 >= 0x1001;
  return local_1;
}

Assistant:

bool bitset_container_negation_range_inplace(bitset_container_t *src,
                                             const int range_start,
                                             const int range_end,
                                             container_t **dst) {
    bitset_flip_range(src->words, (uint32_t)range_start, (uint32_t)range_end);
    src->cardinality = bitset_container_compute_cardinality(src);
    if (src->cardinality > DEFAULT_MAX_SIZE) {
        *dst = src;
        return true;
    }
    *dst = array_container_from_bitset(src);
    bitset_container_free(src);
    return false;
}